

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::Optimize(Prog *this)

{
  InstOp IVar1;
  int iVar2;
  int iVar3;
  iterator piVar4;
  Inst *pIVar5;
  Inst *this_00;
  Inst *ip_00;
  bool bVar6;
  Inst *k;
  Inst *j_1;
  Inst *ip_1;
  iterator piStack_68;
  int id_1;
  iterator i_1;
  Inst *jp;
  int j;
  Inst *ip;
  iterator piStack_40;
  int id;
  iterator i;
  undefined1 local_28 [8];
  Workq q;
  Prog *this_local;
  
  q.dense_ = (int *)this;
  SparseSet::SparseSet((SparseSet *)local_28,this->size_);
  SparseSet::clear((SparseSet *)local_28);
  AddToQueue((Workq *)local_28,this->start_);
  for (piStack_40 = SparseSet::begin((SparseSet *)local_28);
      piVar4 = SparseSet::end((SparseSet *)local_28), piStack_40 != piVar4;
      piStack_40 = piStack_40 + 1) {
    pIVar5 = inst(this,*piStack_40);
    jp._4_4_ = Inst::out(pIVar5);
    while( true ) {
      bVar6 = false;
      if (jp._4_4_ != 0) {
        i_1 = (iterator)inst(this,jp._4_4_);
        IVar1 = Inst::opcode((Inst *)i_1);
        bVar6 = IVar1 == kInstNop;
      }
      if (!bVar6) break;
      jp._4_4_ = Inst::out((Inst *)i_1);
    }
    Inst::set_out(pIVar5,jp._4_4_);
    iVar2 = Inst::out(pIVar5);
    AddToQueue((Workq *)local_28,iVar2);
    IVar1 = Inst::opcode(pIVar5);
    if (IVar1 == kInstAlt) {
      jp._4_4_ = Inst::out1(pIVar5);
      while( true ) {
        bVar6 = false;
        if (jp._4_4_ != 0) {
          i_1 = (iterator)inst(this,jp._4_4_);
          IVar1 = Inst::opcode((Inst *)i_1);
          bVar6 = IVar1 == kInstNop;
        }
        if (!bVar6) break;
        jp._4_4_ = Inst::out((Inst *)i_1);
      }
      (pIVar5->field_1).cap_ = jp._4_4_;
      iVar2 = Inst::out1(pIVar5);
      AddToQueue((Workq *)local_28,iVar2);
    }
  }
  SparseSet::clear((SparseSet *)local_28);
  AddToQueue((Workq *)local_28,this->start_);
  for (piStack_68 = SparseSet::begin((SparseSet *)local_28);
      piVar4 = SparseSet::end((SparseSet *)local_28), piStack_68 != piVar4;
      piStack_68 = piStack_68 + 1) {
    iVar2 = *piStack_68;
    pIVar5 = inst(this,iVar2);
    iVar3 = Inst::out(pIVar5);
    AddToQueue((Workq *)local_28,iVar3);
    IVar1 = Inst::opcode(pIVar5);
    if (IVar1 == kInstAlt) {
      iVar3 = Inst::out1(pIVar5);
      AddToQueue((Workq *)local_28,iVar3);
    }
    IVar1 = Inst::opcode(pIVar5);
    if (IVar1 == kInstAlt) {
      iVar3 = Inst::out(pIVar5);
      this_00 = inst(this,iVar3);
      iVar3 = Inst::out1(pIVar5);
      ip_00 = inst(this,iVar3);
      IVar1 = Inst::opcode(this_00);
      if ((((IVar1 == kInstByteRange) && (iVar3 = Inst::out(this_00), iVar3 == iVar2)) &&
          (iVar3 = Inst::lo(this_00), iVar3 == 0)) &&
         ((iVar3 = Inst::hi(this_00), iVar3 == 0xff && (bVar6 = IsMatch(this,ip_00), bVar6)))) {
        Inst::set_opcode(pIVar5,kInstAltMatch);
      }
      else {
        bVar6 = IsMatch(this,this_00);
        if ((((bVar6) &&
             ((IVar1 = Inst::opcode(ip_00), IVar1 == kInstByteRange &&
              (iVar3 = Inst::out(ip_00), iVar3 == iVar2)))) && (iVar2 = Inst::lo(ip_00), iVar2 == 0)
            ) && (iVar2 = Inst::hi(ip_00), iVar2 == 0xff)) {
          Inst::set_opcode(pIVar5,kInstAltMatch);
        }
      }
    }
  }
  SparseSet::~SparseSet((SparseSet *)local_28);
  return;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}